

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O0

void __thiscall wasm::ExecutionResults::get(ExecutionResults *this,Module *wasm)

{
  LoggingExternalInterface *this_00;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar1;
  bool bVar2;
  reference this_01;
  pointer pEVar3;
  ostream *poVar4;
  Name *pNVar5;
  Function *func_00;
  mapped_type *this_02;
  SmallVector<wasm::Literal,_1UL> *this_03;
  size_t sVar6;
  value_type *pvVar7;
  Module *this_04;
  Iterator IVar8;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar9;
  Name name;
  Name name_00;
  Name NVar10;
  size_t local_528;
  TrapException *anon_var_0;
  HostLimitException *anon_var_0_1;
  undefined1 local_478 [8];
  value_type value;
  Iterator __end5;
  Iterator __begin5;
  type *__range5;
  type *values;
  FunctionResult ret;
  Function *func;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  undefined1 local_378 [56];
  undefined1 local_340 [8];
  ModuleRunner instance;
  LoggingExternalInterface interface;
  Module *wasm_local;
  ExecutionResults *this_local;
  
  this_00 = (LoggingExternalInterface *)
            &instance.super_ModuleRunnerBase<wasm::ModuleRunner>.linkedInstances._M_t._M_impl.
             super__Rb_tree_header._M_node_count;
  LoggingExternalInterface::LoggingExternalInterface(this_00,&this->loggings,wasm);
  local_378._32_8_ = (_Base_ptr)0x0;
  local_378._40_8_ = (pointer)0x0;
  local_378._16_8_ = (_Base_ptr)0x0;
  local_378._24_8_ = (_Base_ptr)0x0;
  local_378._0_8_ = (pointer)0x0;
  local_378._8_8_ = (pointer)0x0;
  this_04 = (Module *)local_378;
  std::
  map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  ::map((map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
         *)this_04);
  ModuleRunner::ModuleRunner
            ((ModuleRunner *)local_340,wasm,(ExternalInterface *)this_00,
             (map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
              *)this_04);
  std::
  map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  ::~map((map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
          *)local_378);
  ExpressionRunner<wasm::ModuleRunner>::setRelaxedBehavior
            ((ExpressionRunner<wasm::ModuleRunner> *)local_340,Execute);
  ModuleRunnerBase<wasm::ModuleRunner>::instantiate
            ((ModuleRunnerBase<wasm::ModuleRunner> *)local_340);
  LoggingExternalInterface::setModuleRunner
            ((LoggingExternalInterface *)
             &instance.super_ModuleRunnerBase<wasm::ModuleRunner>.linkedInstances._M_t._M_impl.
              super__Rb_tree_header._M_node_count,(ModuleRunner *)local_340);
  __end2 = std::
           vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ::begin(&wasm->exports);
  exp = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
        std::
        vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ::end(&wasm->exports);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                                     *)&exp), bVar2) {
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
              ::operator*(&__end2);
    pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->(this_01);
    if (pEVar3->kind == Function) {
      poVar4 = std::operator<<((ostream *)&std::cout,"[fuzz-exec] calling ");
      pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (this_01);
      name.super_IString.str._M_str = (char *)this_04;
      name.super_IString.str._M_len = (size_t)(pEVar3->name).super_IString.str._M_str;
      poVar4 = wasm::operator<<((wasm *)poVar4,(ostream *)(pEVar3->name).super_IString.str._M_len,
                                name);
      std::operator<<(poVar4,"\n");
      pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (this_01);
      pNVar5 = Export::getInternalName(pEVar3);
      ret.
      super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
      .
      super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
      .
      super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
      .
      super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
      .
      super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
      .
      super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
      ._56_8_ = (pNVar5->super_IString).str._M_len;
      NVar10.super_IString.str._M_str =
           (char *)ret.
                   super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                   .
                   super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                   .
                   super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                   .
                   super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                   .
                   super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                   .
                   super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                   ._56_8_;
      NVar10.super_IString.str._M_len = (size_t)wasm;
      func_00 = (Function *)::wasm::Module::getFunction(NVar10);
      this_04 = wasm;
      run((FunctionResult *)&values,this,func_00,wasm,(ModuleRunner *)local_340);
      pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (this_01);
      this_02 = std::
                map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
                ::operator[](&this->results,&pEVar3->name);
      std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
      ::operator=(this_02,(variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                           *)&values);
      this_03 = &std::
                 get_if<wasm::Literals,wasm::Literals,wasm::ExecutionResults::Trap,wasm::ExecutionResults::Exception>
                           ((variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                             *)&values)->super_SmallVector<wasm::Literal,_1UL>;
      if ((this_03 != (SmallVector<wasm::Literal,_1UL> *)0x0) &&
         (sVar6 = SmallVector<wasm::Literal,_1UL>::size(this_03), sVar6 != 0)) {
        poVar4 = std::operator<<((ostream *)&std::cout,"[fuzz-exec] note result: ");
        pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                           (this_01);
        name_00.super_IString.str._M_str = (char *)this_04;
        name_00.super_IString.str._M_len = (size_t)(pEVar3->name).super_IString.str._M_str;
        poVar4 = wasm::operator<<((wasm *)poVar4,(ostream *)(pEVar3->name).super_IString.str._M_len,
                                  name_00);
        std::operator<<(poVar4," => ");
        IVar8 = SmallVector<wasm::Literal,_1UL>::begin(this_03);
        __end5.
        super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
        .index = (size_t)IVar8.
                         super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                         .parent;
        IVar9 = (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                 )SmallVector<wasm::Literal,_1UL>::end(this_03);
        IVar1 = IVar9;
        while( true ) {
          __end5.
          super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
          .parent = (SmallVector<wasm::Literal,_1UL> *)IVar1.index;
          value.type.id = (uintptr_t)IVar1.parent;
          local_528 = IVar9.index;
          this_04 = (Module *)IVar9.parent;
          bVar2 = SmallVector<wasm::Literal,_1UL>::
                  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                  ::operator!=((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                *)&__end5.
                                   super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                   .index,(Iterator *)&value.type);
          if (!bVar2) break;
          pvVar7 = SmallVector<wasm::Literal,_1UL>::Iterator::operator*
                             ((Iterator *)
                              &__end5.
                               super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                               .index);
          ::wasm::Literal::Literal((Literal *)local_478,pvVar7);
          ::wasm::Literal::Literal((Literal *)&anon_var_0_1,(Literal *)local_478);
          printValue(this,(Literal *)&anon_var_0_1);
          ::wasm::Literal::~Literal((Literal *)&anon_var_0_1);
          ::wasm::Literal::~Literal((Literal *)local_478);
          SmallVector<wasm::Literal,_1UL>::
          IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
          ::operator++((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                        *)&__end5.
                           super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                           .index);
          IVar1.index = (size_t)__end5.
                                super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                .parent;
          IVar1.parent = (SmallVector<wasm::Literal,_1UL> *)value.type.id;
          IVar9.index = local_528;
          IVar9.parent = (SmallVector<wasm::Literal,_1UL> *)this_04;
        }
      }
      std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
      ::~variant((variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                  *)&values);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
    ::operator++(&__end2);
  }
  ModuleRunner::~ModuleRunner((ModuleRunner *)local_340);
  LoggingExternalInterface::~LoggingExternalInterface
            ((LoggingExternalInterface *)
             &instance.super_ModuleRunnerBase<wasm::ModuleRunner>.linkedInstances._M_t._M_impl.
              super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void get(Module& wasm) {
    LoggingExternalInterface interface(loggings, wasm);
    try {
      ModuleRunner instance(wasm, &interface);
      // This is not an optimization: we want to execute anything, even relaxed
      // SIMD instructions.
      instance.setRelaxedBehavior(ModuleRunner::RelaxedBehavior::Execute);
      instance.instantiate();
      interface.setModuleRunner(&instance);
      // execute all exported methods (that are therefore preserved through
      // opts)
      for (auto& exp : wasm.exports) {
        if (exp->kind != ExternalKind::Function) {
          continue;
        }
        std::cout << "[fuzz-exec] calling " << exp->name << "\n";
        auto* func = wasm.getFunction(*exp->getInternalName());
        FunctionResult ret = run(func, wasm, instance);
        results[exp->name] = ret;
        if (auto* values = std::get_if<Literals>(&ret)) {
          // ignore the result if we hit an unreachable and returned no value
          if (values->size() > 0) {
            std::cout << "[fuzz-exec] note result: " << exp->name << " => ";
            for (auto value : *values) {
              printValue(value);
            }
          }
        }
      }
    } catch (const TrapException&) {
      // May throw in instance creation (init of offsets).
    } catch (const HostLimitException&) {
      // May throw in instance creation (e.g. array.new of huge size).
      // This should be ignored and not compared with, as optimizations can
      // change whether a host limit is reached.
      ignore = true;
    }
  }